

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

size_t __thiscall PPrototype::PropagateMark(PPrototype *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  
  GC::MarkArray((DObject **)(this->ArgumentTypes).Array,(ulong)(this->ArgumentTypes).Count);
  GC::MarkArray((DObject **)(this->ReturnTypes).Array,(ulong)(this->ReturnTypes).Count);
  uVar1 = (this->ReturnTypes).Count;
  uVar2 = (this->ArgumentTypes).Count;
  sVar3 = PSymbolTable::MarkSymbols(&(this->super_PCompoundType).super_PType.Symbols);
  sVar4 = DObject::PropagateMark((DObject *)this);
  return sVar4 + sVar3 + (ulong)(uVar1 + uVar2) * 8;
}

Assistant:

size_t PPrototype::PropagateMark()
{
	GC::MarkArray(ArgumentTypes);
	GC::MarkArray(ReturnTypes);
	return (ArgumentTypes.Size() + ReturnTypes.Size()) * sizeof(void*) +
		Super::PropagateMark();
}